

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int col_2;
  undefined8 *puVar2;
  float *pfVar3;
  float *pfVar4;
  int ndx;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  undefined8 *puVar10;
  tcu *this;
  Vector<float,_2> *pVVar11;
  bool bVar12;
  float v;
  float v_2;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  Matrix<float,_2,_1> blockB;
  Matrix<float,_1,_2> blockC;
  Matrix<float,_1,_2> matC;
  Matrix<float,_2,_1> matB;
  Matrix<float,_1,_2> res;
  Type in0;
  float areaA [4];
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_1> res_2;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> zeroMat;
  float nullField [4];
  Matrix<float,_2,_1> local_148;
  undefined8 local_140;
  Matrix<float,_1,_2> local_138;
  float local_130 [2];
  Matrix<float,_2,_2> local_128;
  undefined4 local_118;
  float local_114;
  undefined8 local_110;
  float local_108;
  undefined4 local_f8;
  undefined4 local_f4;
  Vector<float,_1> local_f0;
  Vector<float,_1> local_ec;
  undefined8 local_e8;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  float fStack_d4;
  undefined8 uStack_d0;
  float local_c8;
  float afStack_c0 [2];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  tcu local_a8 [4];
  float local_a4;
  undefined4 local_9c;
  float local_98 [12];
  undefined1 local_68 [16];
  Vector<float,_2> local_58 [2];
  Matrix<float,_2,_2> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar2 = &local_e8;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        uVar13 = 0x3f800000;
        if (lVar5 != lVar9) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar9) = uVar13;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar5 = lVar5 + 0xc;
    } while (lVar7 != 3);
    local_e8 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_e0 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_dc = (undefined4)uVar1;
    uStack_d8 = (undefined4)((ulong)uVar1 >> 0x20);
    fStack_d4 = evalCtx->in[1].m_data[2];
    uStack_d0 = *(undefined8 *)evalCtx->in[2].m_data;
    local_c8 = evalCtx->in[2].m_data[2];
  }
  else {
    uStack_d8 = 0;
    fStack_d4 = 0.0;
    uStack_d0 = 0;
    local_e8 = 0;
    fStack_e0 = 0.0;
    uStack_dc = 0;
    local_c8 = 0.0;
    puVar6 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar5 = 0;
    do {
      lVar7 = 0;
      puVar10 = puVar2;
      do {
        *(undefined4 *)puVar10 = puVar6[lVar7];
        lVar7 = lVar7 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while (lVar7 != 3);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar6 = puVar6 + 3;
    } while (lVar5 != 3);
  }
  puVar2 = &local_b8;
  local_b8 = CONCAT44(uStack_dc,(int)local_e8);
  local_b0 = local_e8._4_4_;
  local_ac = uStack_d8;
  local_f4 = (undefined4)uStack_d0;
  local_f8 = uStack_d0._4_4_;
  local_ec.m_data[0] = (float  [1])(float  [1])fStack_e0;
  local_f0.m_data[0] = (float  [1])(float  [1])fStack_d4;
  local_68._0_4_ = local_c8;
  local_38 = 0;
  uStack_30 = 0;
  pfVar3 = (float *)&local_128;
  local_128.m_data.m_data[0].m_data[0] = 0.0;
  local_128.m_data.m_data[0].m_data[1] = 0.0;
  local_128.m_data.m_data[1].m_data[0] = 0.0;
  local_128.m_data.m_data[1].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      pfVar3[lVar7 * 2] = (float)*(undefined4 *)((long)puVar2 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar3 = pfVar3 + 1;
    puVar2 = puVar2 + 1;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  pVVar11 = local_58;
  inverse<2>(&local_128);
  lVar5 = 0;
  local_130[1] = (float)local_f8;
  local_130[0] = (float)local_f4;
  local_138.m_data.m_data[1].m_data[0] = local_f0.m_data[0];
  local_138.m_data.m_data[0].m_data[0] = local_ec.m_data[0];
  local_128.m_data.m_data[0].m_data[0] = 0.0;
  local_128.m_data.m_data[0].m_data[1] = 0.0;
  do {
    fVar14 = 1.0;
    if (lVar5 != 0) {
      fVar14 = 0.0;
    }
    local_128.m_data.m_data[0].m_data[lVar5] = fVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  lVar5 = 0;
  do {
    fVar14 = 0.0;
    lVar7 = 0;
    do {
      fVar14 = fVar14 + local_138.m_data.m_data[lVar7].m_data[0] * pVVar11->m_data[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    local_128.m_data.m_data[0].m_data[lVar5] = fVar14;
    pVVar11 = pVVar11 + 1;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  fVar14 = 0.0;
  lVar5 = 0;
  do {
    fVar14 = fVar14 + local_128.m_data.m_data[0].m_data[lVar5] * local_130[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  pfVar3 = (float *)&local_48;
  local_48.m_data.m_data[0].m_data[0] = 0.0;
  local_48.m_data.m_data[0].m_data[1] = 0.0;
  local_48.m_data.m_data[1].m_data[0] = 0.0;
  local_48.m_data.m_data[1].m_data[1] = 0.0;
  puVar2 = &local_38;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      pfVar3[lVar7 * 2] = (float)*(undefined4 *)((long)puVar2 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar3 = pfVar3 + 1;
    puVar2 = puVar2 + 1;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  local_140 = 0;
  lVar5 = 0;
  do {
    uVar13 = 0x3f800000;
    if (lVar5 != 0) {
      uVar13 = 0;
    }
    *(undefined4 *)((long)&local_140 + lVar5 * 4) = uVar13;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  pfVar3 = local_58[0].m_data;
  lVar5 = 0;
  do {
    fVar15 = 0.0;
    lVar7 = 0;
    do {
      fVar15 = fVar15 + pfVar3[lVar7 * 2] * local_130[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    *(float *)((long)&local_140 + lVar5 * 4) = fVar15;
    pfVar3 = pfVar3 + 1;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  local_148.m_data.m_data[0].m_data = (Vector<tcu::Vector<float,_2>,_1>)(Vector<float,_2>  [1])0x0;
  lVar5 = 0;
  do {
    fVar15 = 1.0;
    if (lVar5 != 0) {
      fVar15 = 0.0;
    }
    local_148.m_data.m_data[0].m_data[lVar5] = fVar15;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  fVar14 = 1.0 / ((float)local_68._0_4_ - fVar14);
  lVar5 = 0;
  do {
    local_148.m_data.m_data[0].m_data[lVar5] = *(float *)((long)&local_140 + lVar5 * 4) * fVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_68 = ZEXT416((uint)fVar14);
  pfVar3 = local_98;
  tcu::operator*(&local_148,&local_138);
  pVVar11 = local_58;
  tcu::operator*((tcu *)&local_128,(Matrix<float,_2,_2> *)pfVar3,(Matrix<float,_2,_2> *)pVVar11);
  tcu::operator+(local_a8,(Matrix<float,_2,_2> *)pVVar11,&local_128);
  this = (tcu *)&local_128;
  tcu::operator-(this,&local_48,(Matrix<float,_2,_2> *)pVVar11);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar5 = 0;
  do {
    fVar14 = 1.0;
    if (lVar5 != 0) {
      fVar14 = 0.0;
    }
    local_98[lVar5] = fVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  lVar5 = 0;
  do {
    fVar14 = 0.0;
    lVar7 = 0;
    do {
      fVar14 = fVar14 + *(float *)(this + lVar7 * 8) * local_130[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    local_98[lVar5] = fVar14;
    this = this + 4;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  local_148.m_data.m_data[0].m_data = (Vector<tcu::Vector<float,_2>,_1>)(Vector<float,_2>  [1])0x0;
  lVar5 = 0;
  do {
    fVar14 = 1.0;
    if (lVar5 != 0) {
      fVar14 = 0.0;
    }
    local_148.m_data.m_data[0].m_data[lVar5] = fVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  lVar5 = 0;
  do {
    local_148.m_data.m_data[0].m_data[lVar5] = local_98[lVar5] * (float)local_68._0_4_;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_128.m_data.m_data[0].m_data[0] = 0.0;
  local_128.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    fVar14 = 1.0;
    if (lVar5 != 0) {
      fVar14 = 0.0;
    }
    local_128.m_data.m_data[0].m_data[lVar5] = fVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  lVar5 = 0;
  do {
    fVar14 = 0.0;
    lVar7 = 0;
    do {
      fVar14 = fVar14 + local_138.m_data.m_data[lVar7].m_data[0] *
                        ((Vector<tcu::Vector<float,_2>,_2> *)pVVar11->m_data)->m_data[0].m_data
                        [lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    local_128.m_data.m_data[0].m_data[lVar5] = fVar14;
    pVVar11 = pVVar11 + 1;
    bVar12 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar12);
  local_140 = 0;
  lVar5 = 0;
  do {
    uVar13 = 0x3f800000;
    if (lVar5 != 0) {
      uVar13 = 0;
    }
    *(undefined4 *)((long)&local_140 + lVar5 * 4) = uVar13;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  lVar5 = 0;
  do {
    *(float *)((long)&local_140 + lVar5 * 4) =
         local_128.m_data.m_data[0].m_data[lVar5] * -(float)local_68._0_4_;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  pfVar4 = (float *)&local_128;
  local_128.m_data.m_data[1].m_data[0] = local_148.m_data.m_data[0].m_data[0];
  local_128.m_data.m_data[1].m_data[1] = local_a4;
  local_118 = local_9c;
  local_114 = local_148.m_data.m_data[0].m_data[1];
  local_110 = local_140;
  local_108 = (float)local_68._0_4_;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[8] = 0.0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    pfVar8 = pfVar3;
    do {
      *pfVar8 = pfVar4[lVar7];
      lVar7 = lVar7 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar4 = pfVar4 + 3;
  } while (lVar5 != 3);
  local_128.m_data.m_data[1].m_data = (float  [2])((ulong)(uint)local_a4 << 0x20);
  local_128.m_data.m_data[0].m_data[0] = 0.0;
  local_128.m_data.m_data[0].m_data[1] = 0.0;
  lVar5 = 0;
  do {
    local_128.m_data.m_data[0].m_data[lVar5] = local_98[lVar5] + local_98[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_b0 = 0;
  local_b8 = 0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_b8 + lVar5 * 4) =
         local_128.m_data.m_data[0].m_data[lVar5] + local_98[lVar5 + 6];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_128.m_data.m_data[0].m_data = (float  [2])&evalCtx->color;
  local_128.m_data.m_data[1].m_data[0] = 0.0;
  local_128.m_data.m_data[1].m_data[1] = 1.4013e-45;
  local_118 = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[(int)local_128.m_data.m_data[0].m_data[lVar5]] = afStack_c0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}